

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
* __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::build
          (MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *__return_storage_ptr__,SparseAllocationBuilder *this,DeviceInterface *vk,VkDevice device
          ,Allocator *allocator,VkBufferCreateInfo referenceCreateInfo,VkDeviceSize minChunkSize)

{
  long lVar1;
  SparseAllocation *pSVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  pointer pMVar6;
  VkSparseMemoryBind bind;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_88;
  UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_68;
  SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_> local_58;
  VkMemoryRequirements memoryRequirements;
  
  pSVar2 = (SparseAllocation *)operator_new(0x40);
  *(undefined8 *)pSVar2 = 0;
  pSVar2->resourceSize = 0;
  (pSVar2->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar2->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar2->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar2->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar2->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar2->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ).m_data.ptr = pSVar2;
  referenceCreateInfo.size = 4;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&bind,vk,device,&referenceCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_88.m_data.deleter.m_device = (VkDevice)bind.memory.m_internal;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)bind.memoryOffset;
  local_88.m_data.object.m_internal = bind.resourceOffset;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)bind.size;
  bind.resourceOffset = 0;
  bind.size = 0;
  bind.memory.m_internal = 0;
  bind.memoryOffset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&bind);
  ::vk::getBufferMemoryRequirements
            (&memoryRequirements,vk,device,(VkBuffer)local_88.m_data.object.m_internal);
  uVar3 = CONCAT44(memoryRequirements.alignment._4_4_,(undefined4)memoryRequirements.alignment);
  uVar4 = -uVar3 & (uVar3 + minChunkSize) - 1;
  if (uVar4 < uVar3) {
    uVar4 = uVar3;
  }
  for (puVar5 = (this->m_chunksPerAllocation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 != (this->m_chunksPerAllocation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    bind.resourceOffset = *puVar5 * uVar4;
    bind.size = CONCAT44(memoryRequirements.alignment._4_4_,(undefined4)memoryRequirements.alignment
                        );
    bind.memory.m_internal._4_4_ = memoryRequirements._20_4_;
    bind.memory.m_internal._0_4_ = memoryRequirements.memoryTypeBits;
    (*allocator->_vptr_Allocator[3])(&local_68,allocator,&bind,0);
    makeDeSharedPtr<vk::Allocation>
              ((sparse *)&local_58,
               (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_68);
    std::
    vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>>
    ::
    emplace_back<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>
              ((vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>>
                *)&pSVar2->allocations,&local_58);
    de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>::
    ~SharedPtr(&local_58);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&local_68);
  }
  for (pMVar6 = (this->m_memoryBinds).
                super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 != (this->m_memoryBinds).
                super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                ._M_impl.super__Vector_impl_data._M_finish; pMVar6 = pMVar6 + 1) {
    lVar1 = **(long **)(*(long *)&(pSVar2->allocations).
                                  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data +
                       (ulong)pMVar6->allocationNdx * 0x10);
    bind.resourceOffset = pMVar6->resourceChunkNdx * uVar4;
    bind.size = pMVar6->numChunks * uVar4;
    bind.memory.m_internal = *(deUint64 *)(lVar1 + 8);
    bind.memoryOffset = pMVar6->memoryChunkNdx * uVar4 + *(long *)(lVar1 + 0x10);
    bind.flags = 0;
    std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
              (&pSVar2->memoryBinds,&bind);
    uVar3 = bind.size + bind.resourceOffset;
    if (bind.size + bind.resourceOffset < referenceCreateInfo.size) {
      uVar3 = referenceCreateInfo.size;
    }
    referenceCreateInfo.size = uVar3;
  }
  pSVar2->resourceSize = referenceCreateInfo.size;
  pSVar2->numResourceChunks = this->m_resourceChunkNdx;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_88);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<SparseAllocation> SparseAllocationBuilder::build (const DeviceInterface&	vk,
														  const VkDevice			device,
														  Allocator&				allocator,
														  VkBufferCreateInfo		referenceCreateInfo,
														  const VkDeviceSize		minChunkSize) const
{

	MovePtr<SparseAllocation>	sparseAllocation			(new SparseAllocation());

								referenceCreateInfo.size	= sizeof(deUint32);
	const Unique<VkBuffer>		refBuffer					(createBuffer(vk, device, &referenceCreateInfo));
	const VkMemoryRequirements	memoryRequirements			= getBufferMemoryRequirements(vk, device, *refBuffer);
	const VkDeviceSize			chunkSize					= std::max(memoryRequirements.alignment, static_cast<VkDeviceSize>(deAlign64(minChunkSize, memoryRequirements.alignment)));

	for (std::vector<deUint32>::const_iterator numChunksIter = m_chunksPerAllocation.begin(); numChunksIter != m_chunksPerAllocation.end(); ++numChunksIter)
	{
		sparseAllocation->allocations.push_back(makeDeSharedPtr(
			allocator.allocate(requirementsWithSize(memoryRequirements, *numChunksIter * chunkSize), MemoryRequirement::Any)));
	}

	for (std::vector<MemoryBind>::const_iterator memBindIter = m_memoryBinds.begin(); memBindIter != m_memoryBinds.end(); ++memBindIter)
	{
		const Allocation&			alloc	= **sparseAllocation->allocations[memBindIter->allocationNdx];
		const VkSparseMemoryBind	bind	=
		{
			memBindIter->resourceChunkNdx * chunkSize,							// VkDeviceSize               resourceOffset;
			memBindIter->numChunks * chunkSize,									// VkDeviceSize               size;
			alloc.getMemory(),													// VkDeviceMemory             memory;
			alloc.getOffset() + memBindIter->memoryChunkNdx * chunkSize,		// VkDeviceSize               memoryOffset;
			(VkSparseMemoryBindFlags)0,											// VkSparseMemoryBindFlags    flags;
		};
		sparseAllocation->memoryBinds.push_back(bind);
		referenceCreateInfo.size = std::max(referenceCreateInfo.size, bind.resourceOffset + bind.size);
	}

	sparseAllocation->resourceSize		= referenceCreateInfo.size;
	sparseAllocation->numResourceChunks = m_resourceChunkNdx;

	return sparseAllocation;
}